

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int statecmp(config *a,config *b)

{
  uint uVar1;
  uint uVar2;
  
  if (b != (config *)0x0 && a != (config *)0x0) {
    do {
      uVar2 = a->rp->index - b->rp->index;
      if (uVar2 == 0) {
        uVar2 = a->dot - b->dot;
      }
      a = a->bp;
      b = b->bp;
    } while (((uVar2 == 0) && (a != (config *)0x0)) && (b != (config *)0x0));
    uVar1 = -(uint)(b != (config *)0x0) | (uint)(a != (config *)0x0);
    if (uVar2 != 0) {
      uVar1 = uVar2;
    }
    return uVar1;
  }
  return -(uint)(b != (config *)0x0) | (uint)(a != (config *)0x0);
}

Assistant:

PRIVATE int statecmp(struct config *a, struct config *b)
{
  int rc;
  for(rc=0; rc==0 && a && b;  a=a->bp, b=b->bp){
    rc = a->rp->index - b->rp->index;
    if( rc==0 ) rc = a->dot - b->dot;
  }
  if( rc==0 ){
    if( a ) rc = 1;
    if( b ) rc = -1;
  }
  return rc;
}